

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gest_trainer.cpp
# Opt level: O1

void __thiscall Am_Gesture_Trainer_Data::~Am_Gesture_Trainer_Data(Am_Gesture_Trainer_Data *this)

{
  ~Am_Gesture_Trainer_Data(this);
  operator_delete(this);
  return;
}

Assistant:

Am_Gesture_Trainer_Data::~Am_Gesture_Trainer_Data()
{
  Gesture_Class *c, *next;

  for (c = head; c != nullptr; c = next) {
    next = c->next;
    delete c;
  }
  head = tail = nullptr;
}